

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReshapeStaticLayerParams::~ReshapeStaticLayerParams
          (ReshapeStaticLayerParams *this)

{
  ReshapeStaticLayerParams *this_local;
  
  ~ReshapeStaticLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ReshapeStaticLayerParams::~ReshapeStaticLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ReshapeStaticLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}